

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_utffilter.h
# Opt level: O3

void __thiscall JSONUTF8StringFilter::push_back(JSONUTF8StringFilter *this,uchar ch)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,ch);
  if (this->state != 0) {
    if ((uVar3 & 0xffffffc0) != 0x80) {
      this->is_valid = false;
    }
    iVar2 = this->state + -6;
    this->state = iVar2;
    uVar3 = (uVar3 & 0x3f) << ((byte)iVar2 & 0x1f) | this->codepoint;
    this->codepoint = uVar3;
    if (iVar2 == 0) {
      if (this->state != 0) {
        this->is_valid = false;
      }
      uVar1 = this->surpair;
      if ((uVar3 & 0xfffffc00) == 0xdc00) {
        if (uVar1 != 0) {
          append_codepoint(this,uVar3 + (uVar1 | 0x40) * 0x400 + 0xfc9f2400);
          this->surpair = 0;
          return;
        }
      }
      else if ((uVar3 & 0xfffffc00) == 0xd800) {
        if (uVar1 == 0) {
          this->surpair = uVar3;
          return;
        }
      }
      else if (uVar1 == 0) {
        append_codepoint(this,uVar3);
        return;
      }
      this->is_valid = false;
      return;
    }
    return;
  }
  if (-1 < (char)ch) {
    std::__cxx11::string::push_back((char)this->str);
    return;
  }
  if (0xbf < ch) {
    if (ch < 0xe0) {
      this->codepoint = (uVar3 & 0x1f) << 6;
      this->state = 6;
      return;
    }
    if (ch < 0xf0) {
      this->codepoint = (uVar3 & 0xf) << 0xc;
      this->state = 0xc;
      return;
    }
    if (ch < 0xf8) {
      this->codepoint = (uVar3 & 7) << 0x12;
      this->state = 0x12;
      return;
    }
  }
  this->is_valid = false;
  return;
}

Assistant:

void push_back(unsigned char ch)
    {
        if (state == 0) {
            if (ch < 0x80) // 7-bit ASCII, fast direct pass-through
                str.push_back(ch);
            else if (ch < 0xc0) // Mid-sequence character, invalid in this state
                is_valid = false;
            else if (ch < 0xe0) { // Start of 2-byte sequence
                codepoint = (ch & 0x1f) << 6;
                state = 6;
            } else if (ch < 0xf0) { // Start of 3-byte sequence
                codepoint = (ch & 0x0f) << 12;
                state = 12;
            } else if (ch < 0xf8) { // Start of 4-byte sequence
                codepoint = (ch & 0x07) << 18;
                state = 18;
            } else // Reserved, invalid
                is_valid = false;
        } else {
            if ((ch & 0xc0) != 0x80) // Not a continuation, invalid
                is_valid = false;
            state -= 6;
            codepoint |= (ch & 0x3f) << state;
            if (state == 0)
                push_back_u(codepoint);
        }
    }